

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
lshbox::parseParams_abi_cxx11_
          (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,lshbox *this,int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  undefined4 in_register_00000014;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  string value;
  string key;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  key_type local_50;
  
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  if (1 < (int)this) {
    uVar6 = 1;
    do {
      __s = *(char **)(CONCAT44(in_register_00000014,argc) + uVar6 * 8);
      sVar1 = strlen(__s);
      if (sVar1 == 0) {
LAB_001097ac:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"arguments error, format should be --[key]=[value]",0x31);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/common/util.h"
                      ,0x22,"unordered_map<string, string> lshbox::parseParams(int, const char **)")
        ;
      }
      uVar5 = 0xffffffff;
      uVar3 = 0;
      do {
        if (__s[uVar3] == '=') {
          uVar5 = uVar3 & 0xffffffff;
        }
        uVar3 = uVar3 + 1;
      } while (sVar1 != uVar3);
      if ((((sVar1 < 3) || (*__s != '-')) || (__s[1] != '-')) || (iVar4 = (int)uVar5, iVar4 == -1))
      goto LAB_001097ac;
      local_70[0] = local_60;
      sVar1 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,__s,__s + sVar1);
      std::__cxx11::string::string((string *)&local_50,(string *)local_70,2,(long)(iVar4 + -2));
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      local_70[0] = local_60;
      sVar1 = strlen(__s + (long)iVar4 + 1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,__s + (long)iVar4 + 1,__s + sVar1 + (long)iVar4 + 1);
      pmVar2 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)__return_storage_ptr__,&local_50);
      std::__cxx11::string::_M_assign((string *)pmVar2);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != ((ulong)this & 0xffffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

unordered_map<string, string> parseParams(int argc, const char** argv) {
        unordered_map<string, string> params;
        for (int i = 1; i < argc; ++i) {
            const char* pair = argv[i];
            int length = strlen(pair);
            int sepIdx = -1;
            for (int idx = 0; idx < strlen(pair); ++idx) {
                if (pair[idx] == '=')
                    sepIdx = idx;
            }
            if (strlen(pair) < 3 || pair[0] != '-' || pair[1] != '-' || sepIdx == -1) {
                std::cout << "arguments error, format should be --[key]=[value]" << std::endl;
                assert(false);
            }
            string key(pair, 2, sepIdx - 2);
            string value(pair + sepIdx + 1);
            params[key] = value;
        }
        return params;
    }